

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

QRect __thiscall QAccessibleTable::rect(QAccessibleTable *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  QWidget *this_00;
  QPoint QVar4;
  QAccessibleObject *pQVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  QRect QVar7;
  QPoint local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = &this->super_QAccessibleObject;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar5);
  lVar3 = QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  if ((*(byte *)(*(long *)(lVar3 + 0x20) + 9) & 0x80) == 0) {
    uVar6 = 0xffffffffffffffff;
    QVar4.xp.m_i = 0;
    QVar4.yp.m_i = 0;
  }
  else {
    (**(code **)(*(long *)pQVar5 + 0x18))(pQVar5);
    this_00 = (QWidget *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
    local_38.xp.m_i = 0;
    local_38.yp.m_i = 0;
    QVar4 = QWidget::mapToGlobal(this_00,&local_38);
    (**(code **)(*(long *)pQVar5 + 0x18))(pQVar5);
    lVar3 = QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
    iVar1 = *(int *)(*(long *)(lVar3 + 0x20) + 0x1c);
    iVar2 = *(int *)(*(long *)(lVar3 + 0x20) + 0x14);
    (**(code **)(*(long *)pQVar5 + 0x18))(pQVar5);
    lVar3 = QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
    uVar6 = CONCAT44((QVar4.yp.m_i.m_i + *(int *)(*(long *)(lVar3 + 0x20) + 0x20)) -
                     *(int *)(*(long *)(lVar3 + 0x20) + 0x18),(iVar1 + QVar4.xp.m_i.m_i) - iVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QVar7.x2.m_i = (int)uVar6;
    QVar7.y2.m_i = (int)((ulong)uVar6 >> 0x20);
    QVar7.x1.m_i = QVar4.xp.m_i;
    QVar7.y1.m_i = QVar4.yp.m_i;
    return QVar7;
  }
  __stack_chk_fail();
}

Assistant:

QRect QAccessibleTable::rect() const
{
    if (!view()->isVisible())
        return QRect();
    QPoint pos = view()->mapToGlobal(QPoint(0, 0));
    return QRect(pos.x(), pos.y(), view()->width(), view()->height());
}